

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void keyboardHandleKey(void *userData,wl_keyboard *keyboard,uint32_t serial,uint32_t time,
                      uint32_t scancode,uint32_t state)

{
  _GLFWwindow *window_00;
  int iVar1;
  undefined1 auStack_58 [4];
  xkb_keycode_t keycode;
  itimerspec timer;
  int action;
  int key;
  _GLFWwindow *window;
  uint32_t state_local;
  uint32_t scancode_local;
  uint32_t time_local;
  uint32_t serial_local;
  wl_keyboard *keyboard_local;
  void *userData_local;
  
  window_00 = _glfw.wl.keyboardFocus;
  if (_glfw.wl.keyboardFocus != (_GLFWwindow *)0x0) {
    timer.it_value.tv_nsec._4_4_ = translateKey(scancode);
    timer.it_value.tv_nsec._0_4_ = (uint)(state == 1);
    _glfw.wl.serial = serial;
    memset(auStack_58,0,0x20);
    if ((((uint)timer.it_value.tv_nsec == 1) &&
        (iVar1 = (*_glfw.wl.xkb.keymap_key_repeats)(_glfw.wl.xkb.keymap,scancode + 8), iVar1 != 0))
       && (0 < _glfw.wl.keyRepeatRate)) {
      if (_glfw.wl.keyRepeatRate < 2) {
        _auStack_58 = 1;
      }
      else {
        timer.it_interval.tv_sec = (__time_t)(int)(1000000000 / (long)_glfw.wl.keyRepeatRate);
      }
      timer.it_interval.tv_nsec = (__syscall_slong_t)(_glfw.wl.keyRepeatDelay / 1000);
      timer.it_value.tv_sec = (__time_t)((_glfw.wl.keyRepeatDelay % 1000) * 1000000);
      _glfw.wl.keyRepeatScancode = scancode;
    }
    timerfd_settime(_glfw.wl.keyRepeatTimerfd,0,(itimerspec *)auStack_58,(itimerspec *)0x0);
    _glfwInputKey(window_00,timer.it_value.tv_nsec._4_4_,scancode,(uint)timer.it_value.tv_nsec,
                  _glfw.wl.xkb.modifiers);
    if ((uint)timer.it_value.tv_nsec == 1) {
      inputText(window_00,scancode);
    }
  }
  return;
}

Assistant:

static void keyboardHandleKey(void* userData,
                              struct wl_keyboard* keyboard,
                              uint32_t serial,
                              uint32_t time,
                              uint32_t scancode,
                              uint32_t state)
{
    _GLFWwindow* window = _glfw.wl.keyboardFocus;
    if (!window)
        return;

    const int key = translateKey(scancode);
    const int action =
        state == WL_KEYBOARD_KEY_STATE_PRESSED ? GLFW_PRESS : GLFW_RELEASE;

    _glfw.wl.serial = serial;

    struct itimerspec timer = {0};

    if (action == GLFW_PRESS)
    {
        const xkb_keycode_t keycode = scancode + 8;

        if (xkb_keymap_key_repeats(_glfw.wl.xkb.keymap, keycode) &&
            _glfw.wl.keyRepeatRate > 0)
        {
            _glfw.wl.keyRepeatScancode = scancode;
            if (_glfw.wl.keyRepeatRate > 1)
                timer.it_interval.tv_nsec = 1000000000 / _glfw.wl.keyRepeatRate;
            else
                timer.it_interval.tv_sec = 1;

            timer.it_value.tv_sec = _glfw.wl.keyRepeatDelay / 1000;
            timer.it_value.tv_nsec = (_glfw.wl.keyRepeatDelay % 1000) * 1000000;
        }
    }

    timerfd_settime(_glfw.wl.keyRepeatTimerfd, 0, &timer, NULL);

    _glfwInputKey(window, key, scancode, action, _glfw.wl.xkb.modifiers);

    if (action == GLFW_PRESS)
        inputText(window, scancode);
}